

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcess.c
# Opt level: O0

int runChild(char **cmd,int state,int exception,int value,int share,int output,int delay,
            double timeout,int poll,int repeat,int disown,int createNewGroup,uint interruptDelay)

{
  cmsysProcess *kp_00;
  cmsysProcess *kp;
  int result;
  double timeout_local;
  int output_local;
  int share_local;
  int value_local;
  int exception_local;
  int state_local;
  char **cmd_local;
  
  kp._4_4_ = 1;
  kp_00 = cmsysProcess_New();
  if (kp_00 == (cmsysProcess *)0x0) {
    fprintf(_stderr,"kwsysProcess_New returned NULL!\n");
    cmd_local._4_4_ = 1;
  }
  else {
    do {
      if (repeat < 1) break;
      kp._4_4_ = runChild2(kp_00,cmd,state,exception,value,share,output,delay,timeout,poll,disown,
                           createNewGroup,interruptDelay);
      repeat = repeat + -1;
    } while (kp._4_4_ == 0);
    cmsysProcess_Delete(kp_00);
    cmd_local._4_4_ = kp._4_4_;
  }
  return cmd_local._4_4_;
}

Assistant:

int runChild(const char* cmd[], int state, int exception, int value,
             int share, int output, int delay, double timeout,
             int poll, int repeat, int disown, int createNewGroup,
             unsigned int interruptDelay)
{
  int result = 1;
  kwsysProcess* kp = kwsysProcess_New();
  if(!kp)
    {
    fprintf(stderr, "kwsysProcess_New returned NULL!\n");
    return 1;
    }
  while(repeat-- > 0)
    {
    result = runChild2(kp, cmd, state, exception, value, share,
                       output, delay, timeout, poll, disown, createNewGroup,
                       interruptDelay);
    if(result)
      {
      break;
      }
    }
  kwsysProcess_Delete(kp);
  return result;
}